

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O1

int __thiscall rsg::BlockStatement::init(BlockStatement *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  deUint32 dVar2;
  int extraout_EAX;
  
  iVar1 = *(int *)(*(long *)(ctx + 0x10) + 8);
  dVar2 = deRandom_getUint32(*(deRandom **)(ctx + 8));
  this->m_numChildrenToCreate = dVar2 % (iVar1 + 1U);
  VariableManager::pushVariableScope(*(VariableManager **)(ctx + 0x28),&this->m_scope);
  return extraout_EAX;
}

Assistant:

void BlockStatement::init (GeneratorState& state)
{
	// Select number of children statements to construct
	m_numChildrenToCreate = state.getRandom().getInt(0, state.getShaderParameters().maxStatementsPerBlock);

	// Push scope
	state.getVariableManager().pushVariableScope(m_scope);
}